

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdPrecompute4Vars(void)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  Kit_DsdNtk_t *p;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdMan_t *p_00;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uTruth;
  char Buffer [256];
  uint local_144;
  FILE *local_140;
  char local_138 [2];
  char local_136 [4];
  undefined1 local_132;
  
  local_140 = fopen("5npn/npn4.txt","r");
  pcVar3 = fgets(local_138,100,local_140);
  if (pcVar3 == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    uVar7 = 0;
    do {
      local_132 = 0;
      Extra_ReadHexadecimal(&local_144,local_136,4);
      local_144 = CONCAT22((undefined2)local_144,(undefined2)local_144);
      p = Kit_DsdDecomposeInt(&local_144,4,0);
      pNtk = Kit_DsdExpand(p);
      Kit_DsdNtkFree(p);
      iVar2 = Kit_DsdFindLargeBox_rec(pNtk,(uint)(pNtk->Root >> 1),3);
      if (iVar2 != 0) {
        Kit_DsdTestCofs(pNtk,&local_144);
        putchar(10);
        printf("%3d : Non-DSD function  %s  %s\n",uVar7,local_136,"");
        Kit_DsdPrint(_stdout,pNtk);
        putchar(10);
        uVar5 = uVar5 + 1;
      }
      p_00 = Kit_DsdManAlloc(4,(uint)pNtk->nNodes + (uint)pNtk->nVars);
      puVar4 = Kit_DsdTruthCompute(p_00,pNtk);
      lVar1 = 0;
      do {
        lVar6 = lVar1;
        if (lVar6 == -1) goto LAB_0055612d;
        lVar1 = lVar6 + -1;
      } while (local_144 == puVar4[lVar6]);
      if (lVar6 != -1) {
        puts("Verification failed.");
      }
LAB_0055612d:
      Kit_DsdManFree(p_00);
      Kit_DsdNtkFree(pNtk);
      uVar7 = (ulong)((int)uVar7 + 1);
      pcVar3 = fgets(local_138,100,local_140);
    } while (pcVar3 != (char *)0x0);
  }
  fclose(local_140);
  printf("non-DSD = %d   implementable = %d\n",(ulong)uVar5,0);
  return;
}

Assistant:

void Kit_DsdPrecompute4Vars()
{
    Kit_DsdMan_t * p;
    Kit_DsdNtk_t * pNtk, * pTemp;
    FILE * pFile;
    unsigned uTruth;
    unsigned * pTruthC;
    char Buffer[256];
    int i, RetValue;
    int Counter1 = 0, Counter2 = 0;

    pFile = fopen( "5npn/npn4.txt", "r" );
    for ( i = 0; fgets( Buffer, 100, pFile ); i++ )
    {
        Buffer[6] = 0;
        Extra_ReadHexadecimal( &uTruth, Buffer+2, 4 );
        uTruth = ((uTruth & 0xffff) << 16) | (uTruth & 0xffff);
        pNtk = Kit_DsdDecompose( &uTruth, 4 );

        pNtk = Kit_DsdExpand( pTemp = pNtk );
        Kit_DsdNtkFree( pTemp );


        if ( Kit_DsdFindLargeBox(pNtk, 3) )
        {
//            RetValue = 0;
            RetValue = Kit_DsdTestCofs( pNtk, &uTruth );
            printf( "\n" );
            printf( "%3d : Non-DSD function  %s  %s\n", i, Buffer + 2, RetValue? "implementable" : "" );
            Kit_DsdPrint( stdout, pNtk ), printf( "\n" );

            Counter1++;
            Counter2 += RetValue;
        }

/*
        printf( "%3d : Function  %s   ", i, Buffer + 2 );
        if ( !Kit_DsdFindLargeBox(pNtk, 3) )
            Kit_DsdPrint( stdout, pNtk );
        else
            printf( "\n" );
*/

        p = Kit_DsdManAlloc( 4, Kit_DsdNtkObjNum(pNtk) );
        pTruthC = Kit_DsdTruthCompute( p, pNtk );
        if ( !Extra_TruthIsEqual( &uTruth, pTruthC, 4 ) )
            printf( "Verification failed.\n" );
        Kit_DsdManFree( p );

        Kit_DsdNtkFree( pNtk );
    }
    fclose( pFile );
    printf( "non-DSD = %d   implementable = %d\n", Counter1, Counter2 );
}